

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall
Alg::max_cover_lazy_budget
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double *timeb,int mode)

{
  pointer pvVar1;
  pointer *pppVar2;
  size_t sVar3;
  unsigned_long uVar4;
  pointer pvVar5;
  size_type *psVar6;
  size_type sVar7;
  pointer pvVar8;
  uint *puVar9;
  pointer pdVar10;
  pointer ppVar11;
  pointer __n;
  pointer pvVar12;
  long lVar13;
  Alg *pAVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ostream *poVar18;
  _Bit_type *p_Var19;
  double *pdVar20;
  pointer puVar21;
  uint *puVar22;
  long lVar23;
  pointer *ppuVar24;
  ulong uVar25;
  int iVar26;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  pointer ppVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  size_type *psVar31;
  pointer ppVar32;
  long lVar33;
  Alg *pAVar34;
  size_t degBound;
  vector<double,_std::allocator<double>_> *pvVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined4 uVar46;
  undefined4 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  reference rVar52;
  uint local_23c;
  double local_238;
  vector<double,_std::allocator<double>_> *local_230;
  double local_228;
  double dStack_220;
  ulong local_218;
  Alg *local_210;
  Nodelist vecBound_1;
  double local_1f0;
  double local_1e8;
  double local_1d8;
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  degMap_cost;
  ulong local_1b8;
  vector<double,_std::allocator<double>_> coverage_cost;
  vector<bool,_std::allocator<bool>_> edgeMark_cost;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  miss_nodes_vec;
  Timer timerBound;
  RRsets degMap;
  FRset coverage;
  vector<bool,_std::allocator<bool>_> node_sel_cost;
  vector<bool,_std::allocator<bool>_> edgeMark;
  vector<bool,_std::allocator<bool>_> node_sel;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_238 = budget;
  local_230 = budget_list;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&coverage,(ulong)this->__numV,(value_type_conflict2 *)&edgeMark,
             (allocator_type *)&node_sel);
  uVar17 = (ulong)this->__numV;
  ppuVar24 = (pointer *)
             ((long)&(this->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17 - 1].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8);
  uVar29 = 0;
  while (bVar36 = uVar17 != 0, uVar17 = uVar17 - 1, bVar36) {
    uVar28 = (long)*ppuVar24 - (long)((_Vector_impl_data *)(ppuVar24 + -1))->_M_start >> 3;
    coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = uVar28;
    if (uVar29 < uVar28) {
      uVar29 = uVar28;
    }
    ppuVar24 = ppuVar24 + -3;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&degMap,uVar29 + 1,(allocator_type *)&edgeMark);
  uVar16 = this->__numV;
  while( true ) {
    uVar15 = uVar16 - 1;
    edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15);
    if (uVar16 == 0) break;
    uVar16 = uVar15;
    if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (degMap.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15],(value_type_conflict *)&edgeMark);
      uVar16 = (uint)edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    }
  }
  node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&edgeMark,this->__numRRsets,(bool *)&node_sel,(allocator_type *)&edgeMark_cost);
  edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00)
  ;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&node_sel,(ulong)this->__numV,(bool *)&edgeMark_cost,(allocator_type *)&node_sel_cost);
  dVar37 = min_vector_nonzero_mask(local_230,&node_sel);
  std::operator<<((ostream *)&std::cout,"min_cost: ");
  poVar18 = std::ostream::_M_insert<double>(dVar37);
  std::endl<char,std::char_traits<char>>(poVar18);
  puVar21 = (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar21) {
    (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar21;
  }
  iVar26 = 0;
  uVar17 = 0;
  local_210 = this;
  while( true ) {
    if ((local_238 < dVar37) || (uVar29 == 0)) break;
    local_228 = (double)(uVar29 * 0x18);
    pvVar12 = degMap.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar29;
    lVar33 = (long)degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar29].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar29].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    while( true ) {
      bVar36 = lVar33 == 0;
      lVar33 = lVar33 + -1;
      if (bVar36) break;
      node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p._0_4_ =
           (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar33];
      if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start
          [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] < uVar29) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p],
                   (value_type_conflict *)&node_sel_cost);
      }
      else {
        if ((local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start
            [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] <= local_238) {
          if (mode == 2) {
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            timerBound.__StartTime.__d.__r._0_4_ =
                 (int)coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(uint *)(*(long *)((long)&((degMap.
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                          (long)local_228) + lVar33 * 4)];
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&edgeMark_cost,
                       (uint *)&timerBound);
            lVar23 = 0;
            for (p_Var19 = edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                p_Var19 !=
                (_Bit_type *)
                edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
                p_Var19 = (_Bit_type *)((long)p_Var19 + 4)) {
              lVar23 = lVar23 + (ulong)(uint)*p_Var19;
            }
            lVar23 = lVar23 + uVar17;
            auVar40._8_4_ = (int)((ulong)lVar23 >> 0x20);
            auVar40._0_8_ = lVar23;
            auVar40._12_4_ = 0x45300000;
            sVar3 = local_210->__numRRsets;
            auVar43._8_4_ = (int)(sVar3 >> 0x20);
            auVar43._0_8_ = sVar3;
            auVar43._12_4_ = 0x45300000;
            dVar38 = ((double)local_210->__numV *
                     ((auVar40._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0))) /
                     ((auVar43._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
            local_210->__boundLast_inf = dVar38;
            if (dVar38 < local_210->__boundMin_inf) {
              local_210->__boundMin_inf = dVar38;
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&edgeMark_cost);
          }
          if (iVar26 == 0) {
            uVar4 = coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p];
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&this->__vecSeed_inf,(value_type_conflict *)&node_sel_cost);
            uVar28 = (ulong)(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar28] = 0;
            pvVar5 = (local_210->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar6 = *(pointer *)
                      ((long)&pvVar5[uVar28].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data + 8);
            local_218 = uVar17 + uVar4;
            for (psVar31 = pvVar5[uVar28].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; uVar17 = local_218, psVar31 != psVar6;
                psVar31 = psVar31 + 1) {
              sVar7 = *psVar31;
              rVar52 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,sVar7);
              if ((*rVar52._M_p & rVar52._M_mask) == 0) {
                rVar52 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,sVar7);
                *rVar52._M_p = *rVar52._M_p | rVar52._M_mask;
                pvVar8 = (local_210->__hyperG)._RRsets.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar9 = *(pointer *)
                          ((long)&pvVar8[sVar7].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                for (puVar22 = pvVar8[sVar7].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar22 != puVar9;
                    puVar22 = puVar22 + 1) {
                  if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[*puVar22] != 0) {
                    coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[*puVar22] =
                         coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar22] - 1;
                  }
                }
              }
            }
          }
          iVar26 = iVar26 + 1;
        }
        if (iVar26 == 2) goto LAB_0010542b;
      }
    }
    if (iVar26 == 2) break;
    degMap.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         degMap.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&(degMap.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar29 = uVar29 - 1;
  }
LAB_0010542b:
  pAVar14 = local_210;
  uVar16 = local_210->__numV;
  sVar3 = local_210->__numRRsets;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pvVar35 = local_230;
  poVar18 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ");
  poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
  std::operator<<(poVar18," ");
  uVar47 = SUB164(ZEXT816(0x4530000043300000),4);
  auVar48._8_4_ = (int)(uVar17 >> 0x20);
  auVar48._0_8_ = uVar17;
  auVar48._12_4_ = uVar47;
  uVar46 = SUB164(ZEXT816(0x4530000043300000),0);
  auVar49._8_4_ = (int)(sVar3 >> 0x20);
  auVar49._0_8_ = sVar3;
  auVar49._12_4_ = uVar47;
  dVar37 = ((double)uVar16 *
           ((auVar48._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(uVar46,(int)uVar17) - 4503599627370496.0))) /
           ((auVar49._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(uVar46,(int)sVar3) - 4503599627370496.0));
  poVar18 = std::ostream::_M_insert<double>(dVar37);
  std::operator<<(poVar18,", min-bound: ");
  poVar18 = std::ostream::_M_insert<double>(pAVar14->__boundMin_inf);
  std::operator<<(poVar18,", last-bound: ");
  poVar18 = std::ostream::_M_insert<double>(pAVar14->__boundLast_inf);
  std::operator<<(poVar18,'\n');
  edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&coverage_cost,(ulong)pAVar14->__numV,(value_type_conflict4 *)&edgeMark_cost,
             (allocator_type *)&node_sel_cost);
  uVar17 = (ulong)pAVar14->__numV;
  pdVar10 = (pvVar35->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppuVar24 = (pointer *)
             ((long)&(pAVar14->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17 - 1].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8);
  uVar29 = uVar17;
  while (bVar36 = uVar29 != 0, uVar29 = uVar29 - 1, bVar36) {
    lVar33 = (long)*ppuVar24 - (long)((_Vector_impl_data *)(ppuVar24 + -1))->_M_start;
    lVar23 = lVar33 >> 3;
    dVar38 = pdVar10[uVar29];
    auVar45._8_4_ = (int)(lVar33 >> 0x23);
    auVar45._0_8_ = lVar23;
    auVar45._12_4_ = 0x45300000;
    dVar39 = 0.0;
    if (*ppuVar24 != ((_Vector_impl_data *)(ppuVar24 + -1))->_M_start) {
      dVar39 = (double)(~-(ulong)(ABS(dVar38) <= 1e-10) &
                       (ulong)(((auVar45._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0)) /
                              dVar38));
    }
    coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar29] = dVar39;
    ppuVar24 = ppuVar24 + -3;
  }
  local_218 = 0;
  while (bVar36 = uVar17 != 0, uVar17 = uVar17 - 1, bVar36) {
    if (local_218 <=
        (ulong)(long)((int)coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar17] + 1)) {
      local_218 = (long)((int)coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar17] + 1);
    }
  }
  poVar18 = std::operator<<((ostream *)&std::cout,"maxDeg: ");
  poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
  std::endl<char,std::char_traits<char>>(poVar18);
  std::
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ::vector(&degMap_cost,local_218 + 1,(allocator_type *)&edgeMark_cost);
  p_Var19 = (_Bit_type *)(ulong)pAVar14->__numV;
  while (pAVar14 = local_210, p_Var19 = (_Bit_type *)((long)p_Var19 - 1),
        p_Var19 != (_Bit_type *)0xffffffffffffffff) {
    dVar38 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(long)p_Var19];
    if (1e-10 < ABS(dVar38)) {
      edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = p_Var19;
      edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ = dVar38;
      std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
      emplace_back<std::pair<unsigned_long,double>>
                ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                  *)(degMap_cost.
                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)(int)dVar38 + 1),
                 (pair<unsigned_long,_double> *)&edgeMark_cost);
    }
  }
  miss_nodes_vec.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  miss_nodes_vec.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  miss_nodes_vec.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p._0_4_ =
       (uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&edgeMark_cost,local_210->__numRRsets,(bool *)&node_sel_cost,
             (allocator_type *)&timerBound);
  timerBound.__StartTime.__d.__r =
       (duration)((ulong)timerBound.__StartTime.__d.__r & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&node_sel_cost,(ulong)pAVar14->__numV,(bool *)&timerBound,(allocator_type *)&vecBound_1
            );
  local_1f0 = min_vector_nonzero_mask(pvVar35,&node_sel_cost);
  timerBound.__StartTime.__d.__r = (duration)0;
  timerBound.__LastTime.__d.__r = (duration)0;
  timerBound.__EndTime.__d.__r = (duration)0;
  timerBound.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  timerBound.__processName = "Bound";
  puVar21 = (pAVar14->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pAVar14->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar21) {
    (pAVar14->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar21;
  }
  local_1b8 = 0;
  local_1d8 = 0.0;
  pAVar34 = pAVar14;
  timerBound.__LastTime.__d.__r = timerBound.__StartTime.__d.__r;
  timerBound.__EndTime.__d.__r = timerBound.__StartTime.__d.__r;
  do {
    uVar29 = local_218;
    uVar17 = local_218 - 1;
    if ((local_218 == 0) || (local_238 < local_1d8 + local_1f0)) {
      uVar16 = pAVar34->__numV;
      sVar3 = pAVar34->__numRRsets;
      poVar18 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ");
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      std::operator<<(poVar18," ");
      auVar50._8_4_ = (int)(local_1b8 >> 0x20);
      auVar50._0_8_ = local_1b8;
      auVar50._12_4_ = 0x45300000;
      auVar51._8_4_ = (int)(sVar3 >> 0x20);
      auVar51._0_8_ = sVar3;
      auVar51._12_4_ = 0x45300000;
      local_1e8 = ((double)uVar16 *
                  ((auVar50._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_1b8) - 4503599627370496.0))) /
                  ((auVar51._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
      poVar18 = std::ostream::_M_insert<double>(local_1e8);
      std::operator<<(poVar18,", min-bound_cost: ");
      poVar18 = std::ostream::_M_insert<double>(pAVar34->__boundMin_inf_cost);
      std::operator<<(poVar18,", last-bound_cost: ");
      poVar18 = std::ostream::_M_insert<double>(pAVar34->__boundLast_inf_cost);
      std::operator<<(poVar18,'\n');
      bVar36 = dVar37 <= local_1e8;
      if (bVar36) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar34->__vecSeed,
                   (pAVar34->__vecSeed_inf_cost).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pAVar34->__vecSeed_inf_cost).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        poVar18 = std::operator<<((ostream *)&std::cout,"Cost Inf: ");
        poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
        std::endl<char,std::char_traits<char>>(poVar18);
      }
      else {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar34->__vecSeed,
                   (pAVar34->__vecSeed_inf).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pAVar34->__vecSeed_inf).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        poVar18 = std::operator<<((ostream *)&std::cout,"Inf: ");
        poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
        std::endl<char,std::char_traits<char>>(poVar18);
        local_1e8 = dVar37;
      }
      pAVar34->__is_inf_cost = bVar36;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&node_sel_cost.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>);
      std::
      _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
      ::~_Vector_base(&miss_nodes_vec.
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     );
      std::
      vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
      ::~vector(&degMap_cost);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&coverage_cost.super__Vector_base<double,_std::allocator<double>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&node_sel.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&edgeMark.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&degMap);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return local_1e8;
    }
    ppVar32 = degMap_cost.
              super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_218].
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = degMap_cost.
              super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_218].
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar32 != ppVar11) {
      uVar28 = (long)ppVar11 - (long)ppVar32 >> 4;
      lVar33 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar33 == 0; lVar33 = lVar33 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                (ppVar32,ppVar11,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppVar11 - (long)ppVar32 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                  (ppVar32,ppVar11);
      }
      else {
        ppVar27 = ppVar32 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                  (ppVar32,ppVar27);
        for (; ppVar27 != ppVar11; ppVar27 = ppVar27 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                    (ppVar27);
        }
      }
    }
    pvVar1 = degMap_cost.
             super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar29;
    lVar33 = (long)degMap_cost.
                   super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar29].
                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)degMap_cost.
                   super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar29].
                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    do {
      lVar30 = lVar33 << 4;
      lVar23 = lVar30;
      while( true ) {
        if (lVar33 == 0) goto LAB_001062ac;
        __n = *(pointer *)
               ((long)&(pvVar1->
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[-1].first + lVar23);
        puVar21 = (pointer)coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[(long)__n];
        if (local_218 <= (ulong)(long)((int)(double)puVar21 + 1)) break;
        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = __n;
        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar21;
        std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
        ::emplace_back<std::pair<unsigned_long,double>>
                  ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                    *)(degMap_cost.
                       super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + ((int)(double)puVar21 + 1)),
                   (pair<unsigned_long,_double> *)&vecBound_1);
        pppVar2 = &degMap_cost.
                   super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar29].
                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + -1;
        lVar33 = lVar33 + -1;
        lVar30 = lVar30 + -0x10;
        lVar23 = lVar23 + -0x10;
      }
      dVar38 = (pvVar35->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)__n];
      if (local_1d8 + dVar38 <= local_238) {
        if (mode == 2) {
          Timer::get_operation_time(&timerBound);
          ppVar11 = miss_nodes_vec.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppVar32 = miss_nodes_vec.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar23 = (long)miss_nodes_vec.
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)miss_nodes_vec.
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_228 = (double)(lVar23 >> 4);
          pdVar20 = &miss_nodes_vec.
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].second;
          uVar28 = (ulong)local_228;
          while (bVar36 = uVar28 != 0, uVar28 = uVar28 - 1, bVar36) {
            *pdVar20 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [((pair<unsigned_long,_double> *)(pdVar20 + -1))->first];
            pdVar20 = pdVar20 + -2;
          }
          if (miss_nodes_vec.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              miss_nodes_vec.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar13 = 0x3f;
            if (local_228 != 0.0) {
              for (; (ulong)local_228 >> lVar13 == 0; lVar13 = lVar13 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                      (miss_nodes_vec.
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       miss_nodes_vec.
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar23 < 0x101) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                        (ppVar32,ppVar11);
            }
            else {
              ppVar27 = ppVar32 + 0x10;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                        (ppVar32,ppVar27);
              for (; ppVar27 != ppVar11; ppVar27 = ppVar27 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                          (ppVar27);
              }
            }
          }
          uVar16 = SUB84(local_228,0) - 1;
          local_228 = 0.0;
          pvVar35 = local_230;
          for (lVar23 = 0;
              (uVar28 = local_218, local_1f0 + local_228 <= local_238 && (lVar33 != lVar23));
              lVar23 = lVar23 + 1) {
            ppVar32 = degMap_cost.
                      super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar29].
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((int)uVar16 < 0) {
              dVar38 = (pvVar35->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start
                       [*(long *)((long)&ppVar32[-1].first + lVar30)];
              if (local_238 < local_228 + dVar38) {
                local_23c = (uint)(long)((local_238 - local_228) *
                                        *(double *)((long)ppVar32 + lVar30 + -8));
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&vecBound_1,&local_23c);
                goto LAB_00105f53;
              }
              local_23c = (uint)(long)(dVar38 * *(double *)((long)ppVar32 + lVar30 + -8));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (&vecBound_1,&local_23c);
              lVar13 = *(long *)((long)&degMap_cost.
                                        super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar29].
                                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar30
                                );
LAB_00105bc7:
              pdVar20 = (pvVar35->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar13;
            }
            else {
              dVar38 = *(double *)((long)ppVar32 + lVar30 + -8);
              dVar39 = miss_nodes_vec.
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].second;
              pdVar10 = (pvVar35->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              if (dVar39 <= dVar38) {
                dVar39 = pdVar10[*(long *)((long)&ppVar32[-1].first + lVar30)];
                if (local_228 + dVar39 <= local_238) {
                  local_23c = (uint)(long)(dVar38 * dVar39);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(&vecBound_1,&local_23c);
                  lVar13 = *(long *)((long)&degMap_cost.
                                            super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar29].
                                            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].first +
                                    lVar30);
                  pvVar35 = local_230;
                  goto LAB_00105bc7;
                }
                local_23c = (uint)(long)((local_238 - local_228) * dVar38);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&vecBound_1,&local_23c);
                goto LAB_00105f53;
              }
              dVar38 = pdVar10[miss_nodes_vec.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].first];
              if (local_238 < local_228 + dVar38) {
                local_23c = (uint)(long)((local_238 - local_228) * dVar39);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&vecBound_1,&local_23c);
                goto LAB_00105f53;
              }
              local_23c = (uint)(long)(dVar39 * dVar38);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (&vecBound_1,&local_23c);
              pdVar20 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start +
                        miss_nodes_vec.
                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar16].first;
              uVar16 = uVar16 - 1;
              pvVar35 = local_230;
            }
            local_228 = local_228 + *pdVar20;
            lVar30 = lVar30 + -0x10;
          }
          while ((local_1f0 + local_228 <= local_238 && (uVar28 = uVar28 - 1, uVar28 != 0))) {
            ppVar32 = degMap_cost.
                      super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28].
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar11 = degMap_cost.
                      super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28].
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar32 != ppVar11) {
              uVar25 = (long)ppVar11 - (long)ppVar32 >> 4;
              lVar23 = 0x3f;
              if (uVar25 != 0) {
                for (; uVar25 >> lVar23 == 0; lVar23 = lVar23 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                        (ppVar32,ppVar11,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
              if ((long)ppVar11 - (long)ppVar32 < 0x101) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                          (ppVar32,ppVar11);
              }
              else {
                ppVar27 = ppVar32 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                          (ppVar32,ppVar27);
                for (; ppVar27 != ppVar11; ppVar27 = ppVar27 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                            (ppVar27);
                }
              }
            }
            lVar23 = (long)degMap_cost.
                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar28].
                           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)degMap_cost.
                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar28].
                           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar30 = lVar23 >> 4;
            while ((local_1f0 + local_228 <= local_238 &&
                   (bVar36 = lVar30 != 0, lVar30 = lVar30 + -1, bVar36))) {
              ppVar32 = degMap_cost.
                        super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar28].
                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((int)uVar16 < 0) {
                dVar38 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start
                         [*(long *)((long)&ppVar32[-1].first + lVar23)];
                if (local_238 < local_228 + dVar38) {
                  local_23c = (uint)(long)((local_238 - local_228) *
                                          *(double *)((long)ppVar32 + lVar23 + -8));
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(&vecBound_1,&local_23c);
                  goto LAB_00105f53;
                }
                local_23c = (uint)(long)(dVar38 * *(double *)((long)ppVar32 + lVar23 + -8));
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&vecBound_1,&local_23c);
LAB_00105e10:
                pdVar20 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start +
                          *(long *)((long)&degMap_cost.
                                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar28].
                                           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[-1].first +
                                   lVar23);
              }
              else {
                dVar38 = *(double *)((long)ppVar32 + lVar23 + -8);
                dVar39 = miss_nodes_vec.
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].second;
                pdVar10 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if (dVar39 <= dVar38) {
                  dVar39 = pdVar10[*(long *)((long)&ppVar32[-1].first + lVar23)];
                  if (local_228 + dVar39 <= local_238) {
                    local_23c = (uint)(long)(dVar38 * dVar39);
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    emplace_back<unsigned_int>(&vecBound_1,&local_23c);
                    goto LAB_00105e10;
                  }
                  local_23c = (uint)(long)((local_238 - local_228) * dVar38);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(&vecBound_1,&local_23c);
                  goto LAB_00105f53;
                }
                dVar38 = pdVar10[miss_nodes_vec.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar16].first];
                if (local_238 < local_228 + dVar38) {
                  local_23c = (uint)(long)((local_238 - local_228) * dVar39);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(&vecBound_1,&local_23c);
                  goto LAB_00105f53;
                }
                local_23c = (uint)(long)(dVar39 * dVar38);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&vecBound_1,&local_23c);
                pdVar20 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start +
                          miss_nodes_vec.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16].first;
                uVar16 = uVar16 - 1;
              }
              local_228 = local_228 + *pdVar20;
              lVar23 = lVar23 + -0x10;
            }
          }
LAB_00105f53:
          std::
          __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          make_min_heap(&vecBound_1);
          lVar23 = 0;
          for (puVar21 = vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              puVar21 !=
              vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish; puVar21 = puVar21 + 1) {
            lVar23 = lVar23 + (ulong)*puVar21;
          }
          lVar23 = lVar23 + local_1b8;
          uVar47 = SUB164(ZEXT816(0x4530000043300000),4);
          auVar41._8_4_ = (int)((ulong)lVar23 >> 0x20);
          auVar41._0_8_ = lVar23;
          auVar41._12_4_ = uVar47;
          uVar46 = SUB164(ZEXT816(0x4530000043300000),0);
          sVar3 = local_210->__numRRsets;
          auVar44._8_4_ = (int)(sVar3 >> 0x20);
          auVar44._0_8_ = sVar3;
          auVar44._12_4_ = uVar47;
          dVar38 = ((double)local_210->__numV *
                   ((auVar41._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(uVar46,(int)lVar23) - 4503599627370496.0))) /
                   ((auVar44._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(uVar46,(int)sVar3) - 4503599627370496.0));
          local_210->__boundLast_inf_cost = dVar38;
          if (dVar38 < local_210->__boundMin_inf_cost) {
            local_210->__boundMin_inf_cost = dVar38;
          }
          dVar38 = Timer::get_operation_time(&timerBound);
          *timeb = dVar38 + *timeb;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          puVar21 = (pointer)coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[(long)__n];
          dVar38 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[(long)__n];
          pvVar35 = local_230;
        }
        auVar42._0_8_ = (double)CONCAT44(0x43300000,(int)local_1b8);
        auVar42._8_4_ = (int)(local_1b8 >> 0x20);
        auVar42._12_4_ = 0x45300000;
        dStack_220 = auVar42._8_8_ - 1.9342813113834067e+25;
        local_228 = dStack_220 + (auVar42._0_8_ - 4503599627370496.0) + dVar38 * (double)puVar21;
        dVar38 = local_228 - 9.223372036854776e+18;
        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(vecBound_1.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,(int)__n);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&pAVar14->__vecSeed_inf_cost,(uint *)&vecBound_1);
        local_1d8 = local_1d8 +
                    (pvVar35->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[(long)__n];
        coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(long)__n] = 0.0;
        rVar52 = std::vector<bool,_std::allocator<bool>_>::operator[](&node_sel_cost,(size_type)__n)
        ;
        *rVar52._M_p = *rVar52._M_p | rVar52._M_mask;
        local_1f0 = min_vector_nonzero_mask(pvVar35,&node_sel_cost);
        pAVar34 = local_210;
        local_1b8 = (long)dVar38 & (long)local_228 >> 0x3f | (long)local_228;
        pvVar5 = (local_210->__hyperG)._FRsets.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar6 = *(pointer *)
                  ((long)&pvVar5[(long)__n].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (psVar31 = pvVar5[(long)__n].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; psVar31 != psVar6; psVar31 = psVar31 + 1) {
          sVar7 = *psVar31;
          rVar52 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark_cost,sVar7);
          if ((*rVar52._M_p & rVar52._M_mask) == 0) {
            rVar52 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark_cost,sVar7);
            *rVar52._M_p = *rVar52._M_p | rVar52._M_mask;
            pvVar12 = (pAVar34->__hyperG)._RRsets.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar9 = *(pointer *)
                      ((long)&pvVar12[sVar7].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8);
            pdVar10 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            for (puVar22 = pvVar12[sVar7].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar22 != puVar9;
                puVar22 = puVar22 + 1) {
              uVar16 = *puVar22;
              dVar38 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
              if ((dVar38 != 0.0) || (NAN(dVar38))) {
                dVar39 = pdVar10[uVar16];
                coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16] = (dVar38 * dVar39 + -1.0) / dVar39;
              }
            }
          }
        }
        ppVar32 = degMap_cost.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar29].
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        degMap_cost.
        super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar29].
        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar32;
        uVar28 = local_218;
        while (uVar25 = uVar28 - 1, uVar28 != 0) {
          ppVar11 = degMap_cost.
                    super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar28].
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          lVar23 = (long)ppVar11 -
                   (long)degMap_cost.
                         super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar28].
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          pdVar20 = &ppVar11[-1].second;
          while (bVar36 = lVar23 != 0, lVar23 = lVar23 + -1, uVar28 = uVar25, bVar36) {
            *pdVar20 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [((pair<unsigned_long,_double> *)(pdVar20 + -1))->first];
            pdVar20 = pdVar20 + -2;
          }
        }
        ppVar11 = degMap_cost.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar29].
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar11 != ppVar32) {
          uVar28 = (long)ppVar32 - (long)ppVar11 >> 4;
          lVar23 = 0x3f;
          if (uVar28 != 0) {
            for (; uVar28 >> lVar23 == 0; lVar23 = lVar23 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                    (ppVar11,ppVar32,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)ppVar32 - (long)ppVar11 < 0x101) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                      (ppVar11,ppVar32);
          }
          else {
            ppVar27 = ppVar11 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                      (ppVar11,ppVar27);
            for (; ppVar27 != ppVar32; ppVar27 = ppVar27 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                        (ppVar27);
            }
          }
        }
      }
      else {
        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = __n;
        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar21;
        std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
        ::emplace_back<std::pair<unsigned_long,double>>
                  ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                    *)&miss_nodes_vec,(pair<unsigned_long,_double> *)&vecBound_1);
        pppVar2 = &degMap_cost.
                   super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar29].
                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + -1;
      }
      lVar33 = lVar33 + -1;
      pvVar35 = local_230;
    } while (local_1d8 + local_1f0 <= local_238);
LAB_001062ac:
    degMap_cost.
    super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         degMap_cost.
         super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::
    _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ::~_Vector_base(&(degMap_cost.
                      super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   );
    pAVar34 = local_210;
    local_218 = uVar17;
  } while( true );
}

Assistant:

double Alg::max_cover_lazy_budget(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    size_t maxDeg_cost = 0;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
    }

    // Normalization
    for (auto i = __numV; i--;) {
        if (int(coverage_cost[i]) + 1 > maxDeg_cost) {
            maxDeg_cost = int(coverage_cost[i]) + 1;
        }
    }
    std::cout << "maxDeg: " << maxDeg_cost << std::endl;

    // int(u.inf/u.cost) -> sort(pair<u.id, u.inf/u.cost>)
    std::vector<std::vector<std::pair<size_t, double>>> degMap_cost(maxDeg_cost + 1);
    for (auto i = __numV; i--;) {
        if (fabs(coverage_cost[i]) <= EPS) {
            continue;
        }
        degMap_cost[int(coverage_cost[i]) + 1].push_back(std::make_pair(i, coverage_cost[i]));
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // label miss nodes
    std::vector<std::pair<size_t, double>> miss_nodes_vec;
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t deg = maxDeg_cost; deg > 0; deg--) // Enusre deg > 0
    {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
            return std::get<1>(left) < std::get<1>(right);
        });
        auto & vecNode = degMap_cost[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = std::get<0>(vecNode[idx]);
            const size_t currDeg = int(coverage_cost[argmaxIdx]) + 1;
            if (deg > currDeg) {
                degMap_cost[currDeg].push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
                continue;
            }
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    int miss_idxBound = miss_nodes_vec.size() - 1;
                    bool is_stop = false;
                    for (size_t miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        std::get<1>(miss_nodes_vec[miss_idx]) = coverage_cost[std::get<0>(miss_nodes_vec[miss_idx])];
                    }
                    std::sort(miss_nodes_vec.begin(), miss_nodes_vec.end(), [](auto & left, auto & right) {
                        return std::get<1>(left) < std::get<1>(right);
                    });
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (miss_idxBound >= 0) {
                                if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                        miss_idxBound = miss_idxBound - 1;
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            else {
                                if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                    vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                }
                                else {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            std::sort(degMap_cost[degBound].begin(), degMap_cost[degBound].end(), [](auto & left, auto & right) {
                                return std::get<1>(left) < std::get<1>(right);
                            });
                            idxBound = degMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (miss_idxBound >= 0) {
                                    if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                        if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                    else {
                                        if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                            miss_idxBound = miss_idxBound - 1;
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);

                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + coverage_cost[argmaxIdx] * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (coverage_cost[nodeIdx] == 0) {
                            continue; // This node is seed, skip
                        }
                        coverage_cost[nodeIdx] = (double) (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                 budget_list[nodeIdx];
                    }
                }
                degMap_cost[deg].pop_back();
                for (auto degup = deg; degup > 0; degup--) {
                    auto & vecNodeup = degMap_cost[degup];
                    for(auto idxup = vecNodeup.size(); idxup--;) {
                        std::get<1>(degMap_cost[degup][idxup]) = coverage_cost[std::get<0>(degMap_cost[degup][idxup])];
                    }
                }
                std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
                    return std::get<1>(left) < std::get<1>(right);
                });
            }
            else{
                miss_nodes_vec.push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}